

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int32 acmod_flags2list(acmod_t *acmod)

{
  int iVar1;
  int local_50;
  int32 delta_1;
  int32 sen_1;
  int32 delta;
  int32 sen;
  bitvec_t *flagptr;
  int32 extra_bits;
  int32 total_words;
  int32 total_dists;
  int32 b;
  int32 n;
  int32 l;
  int32 w;
  acmod_t *acmod_local;
  
  acmod_local._4_4_ = acmod->mdef->n_sen;
  if (acmod->compallsen == '\0') {
    b = 0;
    total_dists = 0;
    n = 0;
    _delta = acmod->senone_active_vec;
    for (; n < acmod_local._4_4_ / 0x20; n = n + 1) {
      if (*_delta != 0) {
        for (total_words = 0; total_words < 0x20; total_words = total_words + 1) {
          if (((ulong)*_delta & 1L << ((byte)total_words & 0x3f)) != 0) {
            iVar1 = n * 0x20 + total_words;
            for (delta_1 = iVar1 - b; 0xff < delta_1; delta_1 = delta_1 + -0xff) {
              acmod->senone_active[total_dists] = 0xff;
              total_dists = total_dists + 1;
            }
            acmod->senone_active[total_dists] = (uint8)delta_1;
            total_dists = total_dists + 1;
            b = iVar1;
          }
        }
      }
      _delta = _delta + 1;
    }
    for (total_words = 0; total_words < acmod_local._4_4_ % 0x20; total_words = total_words + 1) {
      if (((ulong)*_delta & 1L << ((byte)total_words & 0x3f)) != 0) {
        iVar1 = n * 0x20 + total_words;
        for (local_50 = iVar1 - b; 0xff < local_50; local_50 = local_50 + -0xff) {
          acmod->senone_active[total_dists] = 0xff;
          total_dists = total_dists + 1;
        }
        acmod->senone_active[total_dists] = (uint8)local_50;
        total_dists = total_dists + 1;
        b = iVar1;
      }
    }
    acmod->n_senone_active = total_dists;
    acmod_local._4_4_ = total_dists;
  }
  else {
    acmod->n_senone_active = acmod_local._4_4_;
  }
  return acmod_local._4_4_;
}

Assistant:

int32
acmod_flags2list(acmod_t *acmod)
{
    int32 w, l, n, b, total_dists, total_words, extra_bits;
    bitvec_t *flagptr;

    total_dists = bin_mdef_n_sen(acmod->mdef);
    if (acmod->compallsen) {
        acmod->n_senone_active = total_dists;
        return total_dists;
    }
    total_words = total_dists / BITVEC_BITS;
    extra_bits = total_dists % BITVEC_BITS;
    w = n = l = 0;
    for (flagptr = acmod->senone_active_vec; w < total_words; ++w, ++flagptr) {
        if (*flagptr == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b) {
            if (*flagptr & (1UL << b)) {
                int32 sen = w * BITVEC_BITS + b;
                int32 delta = sen - l;
                /* Handle excessive deltas "lossily" by adding a few
                   extra senones to bridge the gap. */
                while (delta > 255) {
                    acmod->senone_active[n++] = 255;
                    delta -= 255;
                }
                acmod->senone_active[n++] = delta;
                l = sen;
            }
        }
    }

    for (b = 0; b < extra_bits; ++b) {
        if (*flagptr & (1UL << b)) {
            int32 sen = w * BITVEC_BITS + b;
            int32 delta = sen - l;
            /* Handle excessive deltas "lossily" by adding a few
               extra senones to bridge the gap. */
            while (delta > 255) {
                acmod->senone_active[n++] = 255;
                delta -= 255;
            }
            acmod->senone_active[n++] = delta;
            l = sen;
        }
    }

    acmod->n_senone_active = n;
    E_DEBUG("acmod_flags2list: %d active in frame %d\n",
            acmod->n_senone_active, acmod->output_frame);
    return n;
}